

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O1

void __thiscall SDLInputJoystick::SDLInputJoystick(SDLInputJoystick *this,int DeviceIndex)

{
  int iVar1;
  SDL_Joystick *pSVar2;
  
  (this->super_IJoystickConfig)._vptr_IJoystickConfig =
       (_func_int **)&PTR__SDLInputJoystick_006ee5e8;
  this->DeviceIndex = DeviceIndex;
  this->Multiplier = 1.0;
  (this->Axes).Array = (AxisInfo *)0x0;
  (this->Axes).Most = 0;
  (this->Axes).Count = 0;
  pSVar2 = (SDL_Joystick *)SDL_JoystickOpen(DeviceIndex);
  this->Device = pSVar2;
  if (pSVar2 != (SDL_Joystick *)0x0) {
    iVar1 = SDL_JoystickNumAxes(pSVar2);
    this->NumAxes = iVar1;
    iVar1 = SDL_JoystickNumHats(this->Device);
    this->NumHats = iVar1;
    (*(this->super_IJoystickConfig)._vptr_IJoystickConfig[0x11])(this);
  }
  return;
}

Assistant:

SDLInputJoystick(int DeviceIndex) : DeviceIndex(DeviceIndex), Multiplier(1.0f)
	{
		Device = SDL_JoystickOpen(DeviceIndex);
		if(Device != NULL)
		{
			NumAxes = SDL_JoystickNumAxes(Device);
			NumHats = SDL_JoystickNumHats(Device);

			SetDefaultConfig();
		}
	}